

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O3

string * __thiscall
ot::commissioner::Error::ToString_abi_cxx11_(string *__return_storage_ptr__,Error *this)

{
  long *plVar1;
  long *plVar2;
  ErrorCode in_EDX;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->mCode == kNone) {
    local_58 = 2;
    local_50 = CONCAT53(local_50._3_5_,0x4b4f);
    local_60 = &local_50;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    local_40._M_dataplus._M_p = (pointer)local_60;
    if (local_60 == &local_50) {
      return __return_storage_ptr__;
    }
  }
  else {
    ErrorCodeToString_abi_cxx11_(&local_40,(commissioner *)(ulong)this->mCode,in_EDX);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_70 = *plVar2;
      lStack_68 = plVar1[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar2;
      local_80 = (long *)*plVar1;
    }
    local_78 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_80,(ulong)(this->mMessage)._M_dataplus._M_p);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_50 = *plVar2;
      lStack_48 = plVar1[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar2;
      local_60 = (long *)*plVar1;
    }
    local_58 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_40._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string Error::ToString() const
{
    std::string ret;
    if (GetCode() == ErrorCode::kNone)
    {
        ret = ErrorCodeToString(ErrorCode::kNone);
    }
    else
    {
        ret = ErrorCodeToString(GetCode()) + ": " + mMessage;
    }
    return ret;
}